

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_reusable_string_stream.hpp
# Opt level: O3

ReusableStringStream * __thiscall
Catch::ReusableStringStream::operator<<(ReusableStringStream *this,SwapchainError *value)

{
  basic_ostream<char,_std::char_traits<char>_> *__os;
  error_code eVar1;
  error_code local_20;
  
  __os = this->m_oss;
  eVar1 = vkb::make_error_code(*value);
  local_20._M_cat = eVar1._M_cat;
  local_20._M_value = eVar1._M_value;
  std::operator<<(__os,&local_20);
  return this;
}

Assistant:

auto operator << ( T const& value ) -> ReusableStringStream& {
            *m_oss << value;
            return *this;
        }